

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMask.cpp
# Opt level: O3

void __thiscall chrono::ChLinkMask::~ChLinkMask(ChLinkMask *this)

{
  ChConstraintTwoBodies *pCVar1;
  pointer ppCVar2;
  int iVar3;
  long lVar4;
  
  this->_vptr_ChLinkMask = (_func_int **)&PTR__ChLinkMask_00b15ac0;
  iVar3 = this->nconstr;
  if (0 < iVar3) {
    lVar4 = 0;
    do {
      pCVar1 = (this->constraints).
               super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar4];
      if (pCVar1 != (ChConstraintTwoBodies *)0x0) {
        (**(code **)((long)(pCVar1->super_ChConstraintTwo).super_ChConstraint._vptr_ChConstraint + 8
                    ))();
        iVar3 = this->nconstr;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < iVar3);
  }
  ppCVar2 = (this->constraints).
            super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2,(long)(this->constraints).
                                  super__Vector_base<chrono::ChConstraintTwoBodies_*,_std::allocator<chrono::ChConstraintTwoBodies_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppCVar2
                   );
    return;
  }
  return;
}

Assistant:

ChLinkMask::~ChLinkMask() {
    for (int i = 0; i < nconstr; i++) {
        if (constraints[i]) {
            delete constraints[i];
        }
    }
}